

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

void __thiscall rw::Material::destroy(Material *this)

{
  int iVar1;
  
  iVar1 = this->refCount;
  this->refCount = iVar1 + -1;
  if (iVar1 < 2) {
    PluginList::destruct((PluginList *)&s_plglist,this);
    if (this->texture != (Texture *)0x0) {
      Texture::destroy(this->texture);
    }
    (*DAT_00148850)(this);
    numAllocated = numAllocated + -1;
  }
  return;
}

Assistant:

void
Material::destroy(void)
{
	this->refCount--;
	if(this->refCount <= 0){
		s_plglist.destruct(this);
		if(this->texture)
			this->texture->destroy();
		rwFree(this);
		numAllocated--;
	}
}